

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt __thiscall slang::SVInt::ashr(SVInt *this,SVInt *rhs)

{
  bool bVar1;
  SVInt *in_RDX;
  SVInt *in_RSI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  SVInt SVar3;
  bitwidth_t unaff_retaddr;
  SVInt *in_stack_00000008;
  undefined8 uVar2;
  
  if (((in_RSI->super_SVIntStorage).signFlag & 1U) == 0) {
    SVar3 = lshr(in_RDX,in_RSI);
    uVar2 = SVar3.super_SVIntStorage._8_8_;
  }
  else {
    bVar1 = hasUnknown(in_RDX);
    if (bVar1) {
      SVar3 = createFillX((bitwidth_t)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
      uVar2 = SVar3.super_SVIntStorage._8_8_;
    }
    else {
      unsignedAmount((SVInt *)in_RDI.pVal);
      SVar3 = ashr(in_stack_00000008,unaff_retaddr);
      uVar2 = SVar3.super_SVIntStorage._8_8_;
    }
  }
  SVar3.super_SVIntStorage.bitWidth = (int)uVar2;
  SVar3.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar2 >> 0x20);
  SVar3.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar2 >> 0x28);
  SVar3.super_SVIntStorage._14_2_ = (short)((ulong)uVar2 >> 0x30);
  SVar3.super_SVIntStorage.field_0.val = in_RDI.val;
  return (SVInt)SVar3.super_SVIntStorage;
}

Assistant:

SVInt SVInt::ashr(const SVInt& rhs) const {
    if (!signFlag)
        return lshr(rhs);
    if (rhs.hasUnknown())
        return createFillX(bitWidth, signFlag);

    return ashr(rhs.unsignedAmount());
}